

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_scanner.cpp
# Opt level: O3

void __thiscall duckdb::SkipScanner::FinalizeChunkProcess(SkipScanner *this)

{
  idx_t *piVar1;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ClientContext *pCVar2;
  bool bVar3;
  CSVBufferHandle *__tmp;
  CSVBufferManager *pos;
  __uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_> _Var4;
  CSVBufferHandle *pCVar5;
  CSVStateMachine *pCVar6;
  _Head_base<0UL,_duckdb::CSVFileHandle_*,_false> local_48;
  ClientContext *pCStack_40;
  
  bVar3 = BaseScanner::FinishedFile(&this->super_BaseScanner);
  if (!bVar3) {
    this_00 = &(this->super_BaseScanner).cur_buffer_handle;
    do {
      if ((this->result).rows_to_skip <= (this->result).row_count) break;
      pos = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                      (&(this->super_BaseScanner).buffer_manager);
      (this->super_BaseScanner).iterator.pos.buffer_idx =
           (this->super_BaseScanner).iterator.pos.buffer_idx + 1;
      CSVBufferManager::GetBuffer((CSVBufferManager *)&stack0xffffffffffffffb8,(idx_t)pos);
      pCVar2 = pCStack_40;
      _Var4._M_t.
      super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>.
      super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl =
           (tuple<duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>)
           (tuple<duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>)
           local_48._M_head_impl;
      local_48._M_head_impl = (CSVFileHandle *)0x0;
      pCStack_40 = (ClientContext *)0x0;
      (this->super_BaseScanner).cur_buffer_handle.internal.
      super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           _Var4._M_t.
           super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>
           .super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl;
      this_01 = (this->super_BaseScanner).cur_buffer_handle.internal.
                super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->super_BaseScanner).cur_buffer_handle.internal.
      super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar2;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        if (pCStack_40 != (ClientContext *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCStack_40);
        }
        _Var4._M_t.
        super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>
        .super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl =
             (tuple<duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>)
             (this_00->internal).
             super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      if ((__uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>)
          _Var4._M_t.
          super__Tuple_impl<0UL,_duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>
          .super__Head_base<0UL,_duckdb::CSVFileHandle_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>_>)0x0)
      {
        (this->super_BaseScanner).iterator.pos.buffer_pos = 0;
        pCVar5 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(pCVar5->handle).node);
        (this->super_BaseScanner).buffer_handle_ptr = (char *)((pCVar5->handle).node.ptr)->buffer;
        BaseScanner::Process<duckdb::SkipResult>(&this->super_BaseScanner,&this->result);
      }
      bVar3 = BaseScanner::FinishedFile(&this->super_BaseScanner);
    } while (!bVar3);
  }
  pCVar6 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                     (&(this->super_BaseScanner).state_machine);
  if (((pCVar6->options->dialect_options).state_machine_options.new_line.value == CARRY_ON) &&
     ((this->super_BaseScanner).states.states[1] == CARRIAGE_RETURN)) {
    piVar1 = &(this->super_BaseScanner).iterator.pos.buffer_pos;
    *piVar1 = *piVar1 + 1;
  }
  bVar3 = BaseScanner::FinishedFile(&this->super_BaseScanner);
  (this->super_BaseScanner).iterator.done = bVar3;
  return;
}

Assistant:

void SkipScanner::FinalizeChunkProcess() {
	// We continue skipping until we skipped enough rows, or we have nothing else to read.
	while (!FinishedFile() && result.row_count < result.rows_to_skip) {
		cur_buffer_handle = buffer_manager->GetBuffer(++iterator.pos.buffer_idx);
		if (cur_buffer_handle) {
			iterator.pos.buffer_pos = 0;
			buffer_handle_ptr = cur_buffer_handle->Ptr();
			Process(result);
		}
	}
	// Skip Carriage Return
	if (state_machine->options.dialect_options.state_machine_options.new_line == NewLineIdentifier::CARRY_ON &&
	    states.states[1] == CSVState::CARRIAGE_RETURN) {
		iterator.pos.buffer_pos++;
	}
	iterator.done = FinishedFile();
}